

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

module * __thiscall
pybind11::module::def<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::__2,char[63]>
          (module *this,char *name_,type *f,char (*extra) [63])

{
  handle local_68;
  PyObject *local_60;
  handle local_58;
  handle local_50;
  sibling local_48;
  scope local_40;
  name local_38;
  handle local_30;
  cpp_function func;
  char (*extra_local) [63];
  type *f_local;
  char *name__local;
  module *this_local;
  
  func.super_function.super_object.super_handle.m_ptr = (function)(function)extra;
  pybind11::name::name(&local_38,name_);
  scope::scope(&local_40,(handle *)this);
  local_58.m_ptr = (this->super_object).super_handle.m_ptr;
  none::none((none *)&local_68);
  local_60 = local_68.m_ptr;
  getattr((pybind11 *)&local_50,local_58,name_,local_68);
  sibling::sibling(&local_48,&local_50);
  cpp_function::
  cpp_function<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::__2,pybind11::name,pybind11::scope,pybind11::sibling,char[63],void>
            ((cpp_function *)&local_30,f,&local_38,&local_40,&local_48,
             (char (*) [63])func.super_function.super_object.super_handle.m_ptr);
  object::~object((object *)&local_50);
  none::~none((none *)&local_68);
  add_object(this,name_,local_30,true);
  cpp_function::~cpp_function((cpp_function *)&local_30);
  return this;
}

Assistant:

module &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }